

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

MergeResult
mergesort_lcp_3way_parallel<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  uchar **strings_input_00;
  lcp_t *lcp_input_00;
  lcp_t *lcp_output_00;
  uchar **strings_input_01;
  lcp_t *lcp_input_01;
  lcp_t *lcp_output_01;
  uchar **strings_output_00;
  MergeResult MVar1;
  MergeResult MVar2;
  MergeResult MVar3;
  lcp_t lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t n_00;
  uchar **strings_output_01;
  char *__assertion;
  MergeResult MVar7;
  size_t n_01;
  uint uVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  double dVar11;
  
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,(size_t)lcp_input);
    for (uVar8 = 1; uVar5 = (ulong)(uVar8 - 1), uVar5 < n - 1; uVar8 = uVar8 + 1) {
      lVar4 = lcp(strings_input[uVar5],strings_input[uVar8]);
      lcp_input[uVar5] = lVar4;
    }
    return SortedInPlace;
  }
  auVar10._8_4_ = (int)(n >> 0x20);
  auVar10._0_8_ = n;
  auVar10._12_4_ = 0x45300000;
  dVar11 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
  uVar5 = n / 3;
  uVar6 = (ulong)dVar11;
  uVar6 = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  MVar1 = mergesort_lcp_3way_parallel<true>(strings_input,strings_output,lcp_input,lcp_output,uVar5)
  ;
  strings_input_00 = strings_input + uVar5;
  strings_output_01 = strings_output + uVar5;
  lcp_input_00 = lcp_input + uVar5;
  lcp_output_00 = lcp_output + uVar5;
  n_01 = uVar6 - uVar5;
  MVar2 = mergesort_lcp_3way_parallel<true>
                    (strings_input_00,strings_output_01,lcp_input_00,lcp_output_00,n_01);
  strings_input_01 = strings_input + uVar6;
  strings_output_00 = strings_output + uVar6;
  lcp_input_01 = lcp_input + uVar6;
  lcp_output_01 = lcp_output + uVar6;
  n_00 = n - uVar6;
  MVar3 = mergesort_lcp_3way_parallel<true>
                    (strings_input_01,strings_output_00,lcp_input_01,lcp_output_01,n_00);
  MVar7 = MVar1;
  if (MVar1 != MVar2) {
    sVar9 = uVar5 * 8;
    if (MVar2 == MVar3) {
      if (MVar1 == SortedInPlace) {
        memcpy(strings_output,strings_input,sVar9);
        memcpy(lcp_output,lcp_input,sVar9);
      }
      else {
        memcpy(strings_input,strings_output,sVar9);
        memcpy(lcp_input,lcp_output,sVar9);
      }
      MVar1 = (MergeResult)(MVar1 == SortedInPlace);
      MVar7 = MVar2;
    }
    else if (MVar2 == SortedInPlace) {
      sVar9 = uVar6 * 8 + uVar5 * -8;
      MVar7 = SortedInTemp;
      if (sVar9 != 0) {
        memcpy(strings_output_01,strings_input_00,sVar9);
        memcpy(lcp_output_00,lcp_input_00,sVar9);
        MVar7 = SortedInTemp;
      }
    }
    else {
      sVar9 = uVar6 * 8 + uVar5 * -8;
      MVar7 = SortedInPlace;
      if (sVar9 != 0) {
        memcpy(strings_input_00,strings_output_01,sVar9);
        memcpy(lcp_input_00,lcp_output_00,sVar9);
        MVar7 = SortedInPlace;
      }
    }
  }
  if (MVar7 != MVar3) {
    if (MVar3 == SortedInPlace) {
      MVar3 = SortedInTemp;
      sVar9 = n * 8 + uVar6 * -8;
      if (sVar9 != 0) {
        memcpy(strings_output_00,strings_input_01,sVar9);
        memcpy(lcp_output_01,lcp_input_01,sVar9);
        MVar3 = SortedInTemp;
      }
    }
    else {
      MVar3 = SortedInPlace;
      sVar9 = n * 8 + uVar6 * -8;
      if (sVar9 != 0) {
        memcpy(strings_input_01,strings_output_00,sVar9);
        memcpy(lcp_input_01,lcp_output_01,sVar9);
        MVar3 = SortedInPlace;
      }
    }
  }
  if (MVar1 == MVar7) {
    if (MVar1 == MVar3) {
      if (MVar1 != SortedInPlace) {
        merge_lcp_3way<true>
                  (strings_output,lcp_output,uVar5,strings_output_01,lcp_output_00,n_01,
                   strings_output_00,lcp_output_01,n_00,strings_input,lcp_input);
        check_input(strings_input,lcp_input,n);
        return SortedInPlace;
      }
      merge_lcp_3way<true>
                (strings_input,lcp_input,uVar5,strings_input_00,lcp_input_00,n_01,strings_input_01,
                 lcp_input_01,n_00,strings_output,lcp_output);
      check_input(strings_output,lcp_output,n);
      return SortedInTemp;
    }
    __assertion = "m1 == m2";
  }
  else {
    __assertion = "m0 == m1";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x397,
                "MergeResult mergesort_lcp_3way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
               );
}

Assistant:

MergeResult
mergesort_lcp_3way_parallel(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0, m1, m2;
#pragma omp task shared(m0)
	m0 = mergesort_lcp_3way_parallel<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
#pragma omp task shared(m1)
	m1 = mergesort_lcp_3way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
#pragma omp task shared(m2)
	m2 = mergesort_lcp_3way_parallel<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
#pragma omp taskwait
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}